

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.cpp
# Opt level: O2

Tracer * __thiscall jaegertracing::Span::tracer(Span *this)

{
  element_type *peVar1;
  shared_ptr<opentracing::v3::Tracer> tracer;
  
  std::mutex::lock(&this->_mutex);
  peVar1 = (this->_tracer).
           super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    opentracing::v3::Tracer::Global();
    if (tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      __assert_fail("tracer",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/Span.cpp"
                    ,0x7e,"virtual const opentracing::Tracer &jaegertracing::Span::tracer() const");
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar1 = (element_type *)
             tracer.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return &peVar1->super_Tracer;
}

Assistant:

const opentracing::Tracer& Span::tracer() const noexcept
{
    std::lock_guard<std::mutex> lock(_mutex);
    if (_tracer) {
        return *_tracer;
    }
    auto tracer = opentracing::Tracer::Global();
    assert(tracer);
    return *tracer;
}